

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  JsonParse *pParse;
  uchar *zPath;
  JsonNode *pNode;
  sqlite3_value **aReplace;
  ulong uVar3;
  ulong uVar4;
  JsonString jx;
  
  if ((1 < argc) && (pParse = jsonParseCached(ctx,argv,ctx), pParse != (JsonParse *)0x0)) {
    jx.zBuf = jx.zSpace;
    jx.nAlloc = 100;
    jx.nUsed = 0;
    jx.bStatic = '\x01';
    jx.bErr = '\0';
    jx.pCtx = ctx;
    jsonAppendChar(&jx,'[');
    for (uVar3 = 1; uVar4 = (ulong)(uint)argc, (uint)argc != uVar3; uVar3 = uVar3 + 1) {
      zPath = sqlite3_value_text(argv[uVar3]);
      pNode = jsonLookup(pParse,(char *)zPath,(int *)0x0,ctx);
      uVar4 = uVar3;
      if (pParse->nErr != '\0') break;
      if (argc == 2) {
        if (pNode != (JsonNode *)0x0) {
          jsonReturn(pNode,ctx,aReplace);
        }
      }
      else {
        jsonAppendSeparator(&jx);
        if (pNode == (JsonNode *)0x0) {
          jsonAppendRaw(&jx,"null",4);
        }
        else {
          jsonRenderNode(pNode,&jx,(sqlite3_value **)0x0);
        }
      }
    }
    if ((int)uVar4 == argc && argc != 2) {
      jsonAppendChar(&jx,']');
      jsonResult(&jx);
      pMVar2 = ctx->pOut;
      pMVar2->eSubtype = 'J';
      pbVar1 = (byte *)((long)&pMVar2->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    jsonReset(&jx);
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  JsonString jx;
  int i;

  if( argc<2 ) return;
  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '[');
  for(i=1; i<argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    pNode = jsonLookup(p, zPath, 0, ctx);
    if( p->nErr ) break;
    if( argc>2 ){
      jsonAppendSeparator(&jx);
      if( pNode ){
        jsonRenderNode(pNode, &jx, 0);
      }else{
        jsonAppendRaw(&jx, "null", 4);
      }
    }else if( pNode ){
      jsonReturn(pNode, ctx, 0);
    }
  }
  if( argc>2 && i==argc ){
    jsonAppendChar(&jx, ']');
    jsonResult(&jx);
    sqlite3_result_subtype(ctx, JSON_SUBTYPE);
  }
  jsonReset(&jx);
}